

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O3

bool __thiscall
cmStandardLevelResolver::GetNewRequiredStandard
          (cmStandardLevelResolver *this,string *targetName,string *feature,
          cmValue currentLangStandardValue,string *newRequiredStandard,string *error)

{
  cmMakefile *makefile;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  StandardNeeded SVar6;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  int *piVar8;
  string *__x;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string lang;
  string local_e8;
  undefined1 local_c8 [32];
  string *local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  char *local_78;
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  char *local_58;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  local_c8._0_8_ = local_c8 + 0x10;
  local_c8._8_8_ = 0;
  local_c8[0x10] = '\0';
  __x = targetName;
  local_a8 = error;
  bVar3 = CheckCompileFeaturesAvailable(this,targetName,feature,(string *)local_c8,error);
  if ((bVar3) &&
     (iVar5 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>_>
              ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>_>
                      *)local_c8,__x),
     iVar5.
     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
     ._M_cur != (__node_type *)0x0)) {
    makefile = this->Makefile;
    if (currentLangStandardValue.Value == (string *)0x0) {
      newRequiredStandard->_M_string_length = 0;
      *(newRequiredStandard->_M_dataplus)._M_p = '\0';
      SVar6 = anon_unknown.dwarf_c4f21f::StandardLevelComputer::HighestStandardNeeded
                        ((StandardLevelComputer *)
                         ((long)iVar5.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                                ._M_cur + 0x28),makefile,feature);
      local_88 = *(undefined8 *)
                  ((long)iVar5.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                         ._M_cur + 0x28);
      local_90 = *(undefined8 *)
                  ((long)iVar5.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                         ._M_cur + 0x30);
      local_a0._M_len = 6;
      local_a0._M_str = "CMAKE_";
      local_80 = 0x11;
      local_78 = "_STANDARD_DEFAULT";
      views._M_len = 3;
      views._M_array = &local_a0;
      cmCatViews_abi_cxx11_(&local_e8,views);
      currentLangStandardValue = cmMakefile::GetDefinition(makefile,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((currentLangStandardValue.Value != (string *)0x0) &&
         ((currentLangStandardValue.Value)->_M_string_length != 0)) goto LAB_002d3336;
      _Var7._M_current =
           *(int **)((long)iVar5.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                           ._M_cur + 0x50);
      piVar8 = _Var7._M_current;
    }
    else {
      std::__cxx11::string::_M_assign((string *)newRequiredStandard);
      SVar6 = anon_unknown.dwarf_c4f21f::StandardLevelComputer::HighestStandardNeeded
                        ((StandardLevelComputer *)
                         ((long)iVar5.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                                ._M_cur + 0x28),makefile,feature);
LAB_002d3336:
      uVar1 = *(undefined8 *)
               ((long)iVar5.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                      ._M_cur + 0x48);
      uVar2 = *(undefined8 *)
               ((long)iVar5.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                      ._M_cur + 0x50);
      iVar4 = anon_unknown.dwarf_c4f21f::ParseStd
                        ((string *)((currentLangStandardValue.Value)->_M_dataplus)._M_p);
      local_a0._M_len = CONCAT44(local_a0._M_len._4_4_,iVar4);
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (uVar1,uVar2);
      piVar8 = *(int **)((long)iVar5.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                               ._M_cur + 0x50);
      if (_Var7._M_current == piVar8) {
        local_88 = *(undefined8 *)
                    ((long)iVar5.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                           ._M_cur + 0x28);
        local_90 = *(undefined8 *)
                    ((long)iVar5.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                           ._M_cur + 0x30);
        local_a0._M_len = 4;
        local_a0._M_str = "The ";
        local_80 = 0x1e;
        local_78 = "_STANDARD property on target \"";
        local_68 = (targetName->_M_dataplus)._M_p;
        local_70 = targetName->_M_string_length;
        local_60 = 0x1f;
        local_58 = "\" contained an invalid value: \"";
        local_48 = ((currentLangStandardValue.Value)->_M_dataplus)._M_p;
        local_50 = (currentLangStandardValue.Value)->_M_string_length;
        local_40 = 2;
        local_38 = "\".";
        views_00._M_len = 7;
        views_00._M_array = &local_a0;
        cmCatViews_abi_cxx11_(&local_e8,views_00);
        if (local_a8 == (string *)0x0) {
          cmMakefile::IssueMessage(makefile,FATAL_ERROR,&local_e8);
        }
        else {
          std::__cxx11::string::_M_assign((string *)local_a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002d353c;
      }
    }
    bVar3 = true;
    if ((SVar6.index != -1) &&
       ((_Var7._M_current == piVar8 ||
        (_Var7._M_current <
         (int *)((((long)SVar6 << 0x20) >> 0x1e) +
                *(long *)((long)iVar5.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                                ._M_cur + 0x48)))))) {
      std::__cxx11::string::_M_assign((string *)newRequiredStandard);
    }
  }
  else {
LAB_002d353c:
    bVar3 = false;
  }
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,CONCAT71(local_c8._17_7_,local_c8[0x10]) + 1);
  }
  return bVar3;
}

Assistant:

bool cmStandardLevelResolver::GetNewRequiredStandard(
  const std::string& targetName, const std::string& feature,
  cmValue currentLangStandardValue, std::string& newRequiredStandard,
  std::string* error) const
{
  std::string lang;
  if (!this->CheckCompileFeaturesAvailable(targetName, feature, lang, error)) {
    return false;
  }

  auto mapping = StandardComputerMapping.find(lang);
  if (mapping != cm::cend(StandardComputerMapping)) {
    return mapping->second.GetNewRequiredStandard(
      this->Makefile, targetName, feature, currentLangStandardValue,
      newRequiredStandard, error);
  }
  return false;
}